

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# receiver_cluster.hpp
# Opt level: O2

vector<Sphere,_std::allocator<Sphere>_> *
treecut(vector<Sphere,_std::allocator<Sphere>_> *__return_storage_ptr__,SphereTree *hierarchy,
       vec3f cluster_center,float cluster_radius,float angle_limit)

{
  float fVar1;
  pointer pSVar2;
  pointer pSVar3;
  float fVar4;
  initializer_list<Sphere> __l;
  vec3f vVar5;
  vec3f local_80;
  vector<Sphere,_std::allocator<Sphere>_> cut;
  SphereTree c;
  
  local_80.z = cluster_center.z;
  local_80._0_8_ = cluster_center._0_8_;
  if ((hierarchy->child).super__Vector_base<SphereTree,_std::allocator<SphereTree>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (hierarchy->child).super__Vector_base<SphereTree,_std::allocator<SphereTree>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    fVar1 = (hierarchy->bound).radius;
    fVar4 = sinf(angle_limit);
    vVar5 = operator-((vec3f *)hierarchy,&local_80);
    if ((SQRT(vVar5.z * vVar5.z + vVar5.x * vVar5.x + vVar5.y * vVar5.y) - cluster_radius) * fVar4
        <= fVar1) {
      (__return_storage_ptr__->super__Vector_base<Sphere,_std::allocator<Sphere>_>)._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (__return_storage_ptr__->super__Vector_base<Sphere,_std::allocator<Sphere>_>)._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      (__return_storage_ptr__->super__Vector_base<Sphere,_std::allocator<Sphere>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      pSVar2 = (hierarchy->child).super__Vector_base<SphereTree,_std::allocator<SphereTree>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      for (pSVar3 = (hierarchy->child).super__Vector_base<SphereTree,_std::allocator<SphereTree>_>.
                    _M_impl.super__Vector_impl_data._M_start; pSVar3 != pSVar2; pSVar3 = pSVar3 + 1)
      {
        SphereTree::SphereTree(&c,pSVar3);
        vVar5.z = local_80.z;
        vVar5.x = local_80.x;
        vVar5.y = local_80.y;
        treecut((vector<Sphere,_std::allocator<Sphere>_> *)
                &cut.super__Vector_base<Sphere,_std::allocator<Sphere>_>,&c,vVar5,cluster_radius,
                angle_limit);
        std::vector<Sphere,std::allocator<Sphere>>::
        insert<__gnu_cxx::__normal_iterator<Sphere*,std::vector<Sphere,std::allocator<Sphere>>>,void>
                  ((vector<Sphere,std::allocator<Sphere>> *)__return_storage_ptr__,
                   (__return_storage_ptr__->super__Vector_base<Sphere,_std::allocator<Sphere>_>).
                   _M_impl.super__Vector_impl_data._M_finish,
                   (__normal_iterator<Sphere_*,_std::vector<Sphere,_std::allocator<Sphere>_>_>)
                   cut.super__Vector_base<Sphere,_std::allocator<Sphere>_>._M_impl.
                   super__Vector_impl_data._M_start,
                   (__normal_iterator<Sphere_*,_std::vector<Sphere,_std::allocator<Sphere>_>_>)
                   cut.super__Vector_base<Sphere,_std::allocator<Sphere>_>._M_impl.
                   super__Vector_impl_data._M_finish);
        std::_Vector_base<Sphere,_std::allocator<Sphere>_>::~_Vector_base
                  (&cut.super__Vector_base<Sphere,_std::allocator<Sphere>_>);
        std::vector<SphereTree,_std::allocator<SphereTree>_>::~vector(&c.child);
      }
      return __return_storage_ptr__;
    }
  }
  c.bound.center.x = (hierarchy->bound).center.x;
  c.bound.center.y = (hierarchy->bound).center.y;
  c.bound._8_8_ = *(undefined8 *)&(hierarchy->bound).center.z;
  __l._M_len = 1;
  __l._M_array = &c.bound;
  std::vector<Sphere,_std::allocator<Sphere>_>::vector
            (__return_storage_ptr__,__l,(allocator_type *)&cut);
  return __return_storage_ptr__;
}

Assistant:

std::vector<Sphere> treecut(const SphereTree& hierarchy, vec3f cluster_center, float cluster_radius, float angle_limit)
{
	// stop recursing if the blockersphere subtends an angle less than angle_limit
	if (hierarchy.child.empty() || hierarchy.bound.radius < sin(angle_limit) * (norm(hierarchy.bound.center - cluster_center) - cluster_radius))
		return {hierarchy.bound};
	std::vector<Sphere> res;
	for (auto c: hierarchy.child)
	{
		auto cut = treecut(c, cluster_center, cluster_radius, angle_limit);
		res.insert(res.end(), cut.begin(), cut.end());
	}
	return res;
}